

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

void * resize(void *ptr,size_t size)

{
  ralloc_header *prVar1;
  ralloc_header *prVar2;
  ralloc_header *prVar3;
  ralloc_header **pprVar4;
  
  prVar2 = get_header(ptr);
  prVar3 = (ralloc_header *)realloc(prVar2,size + 0x30);
  if (prVar3 == (ralloc_header *)0x0) {
    prVar3 = (ralloc_header *)0x0;
  }
  else {
    if ((prVar3 != prVar2) && (prVar1 = prVar3->parent, prVar1 != (ralloc_header *)0x0)) {
      if (prVar1->child == prVar2) {
        prVar1->child = prVar3;
      }
      if (prVar3->prev != (ralloc_header *)0x0) {
        prVar3->prev->next = prVar3;
      }
      if (prVar3->next != (ralloc_header *)0x0) {
        prVar3->next->prev = prVar3;
      }
    }
    pprVar4 = &prVar3->child;
    while (prVar2 = *pprVar4, prVar2 != (ralloc_header *)0x0) {
      prVar2->parent = prVar3;
      pprVar4 = &prVar2->next;
    }
    prVar3 = prVar3 + 1;
  }
  return prVar3;
}

Assistant:

static void *
resize(void *ptr, size_t size)
{
   ralloc_header *child, *old, *info;

   old = get_header(ptr);
   info = realloc(old, size + sizeof(ralloc_header));

   if (info == NULL)
      return NULL;

   /* Update parent and sibling's links to the reallocated node. */
   if (info != old && info->parent != NULL) {
      if (info->parent->child == old)
	 info->parent->child = info;

      if (info->prev != NULL)
	 info->prev->next = info;

      if (info->next != NULL)
	 info->next->prev = info;
   }

   /* Update child->parent links for all children */
   for (child = info->child; child != NULL; child = child->next)
      child->parent = info;

   return PTR_FROM_HEADER(info);
}